

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

TPZVec<double> * __thiscall TPZVec<double>::operator=(TPZVec<double> *this,TPZVec<double> *copy)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this);
    lVar1 = copy->fNElements;
    if (0 < lVar1) {
      pdVar2 = copy->fStore;
      pdVar3 = this->fStore;
      lVar4 = 0;
      do {
        pdVar3[lVar4] = pdVar2[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}